

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ManConstructFromMap
              (Gia_Man_t *pNew,Vec_Int_t *vGates,int nVars,Vec_Int_t *vUsed,Vec_Int_t *vCopy,
              int fHash)

{
  int iVar2;
  int iVar3;
  int iVar4;
  int i_00;
  int local_6c;
  int local_68;
  int iRes1;
  int iRes0;
  int iVar1;
  int iVar0;
  int iTopLit;
  int iLitRes;
  int iLit1;
  int iLit0;
  int i;
  int fHash_local;
  Vec_Int_t *vCopy_local;
  Vec_Int_t *vUsed_local;
  int nVars_local;
  Vec_Int_t *vGates_local;
  Gia_Man_t *pNew_local;
  
  iVar2 = Vec_IntEntryLast(vGates);
  iVar3 = Vec_IntSize(vUsed);
  if (iVar3 != nVars) {
    __assert_fail("Vec_IntSize(vUsed) == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x20f,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  iVar3 = Vec_IntSize(vGates);
  if (iVar3 < 2) {
    __assert_fail("Vec_IntSize(vGates) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x210,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  iVar3 = Vec_IntSize(vGates);
  if (iVar3 % 2 != 1) {
    __assert_fail("Vec_IntSize(vGates) % 2 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x211,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  iVar2 = Abc_Lit2Var(iVar2);
  iVar3 = Vec_IntSize(vGates);
  if (iVar2 - nVars != iVar3 / 2 + -1) {
    __assert_fail("Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(vGates)/2-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x212,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  Vec_IntClear(vCopy);
  iLit1 = 0;
  do {
    iVar2 = Vec_IntSize(vGates);
    if (iVar2 <= iLit1 + 1) {
      iVar2 = Vec_IntSize(vCopy);
      iVar3 = Vec_IntSize(vGates);
      if (iVar2 != iVar3 / 2) {
        __assert_fail("Vec_IntSize(vCopy) == Vec_IntSize(vGates)/2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x22d,
                      "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar2 = Vec_IntSize(vGates);
      iVar2 = Vec_IntEntry(vCopy,iVar2 / 2 + -1);
      return iVar2;
    }
    iVar2 = Vec_IntEntry(vGates,iLit1);
    iVar3 = Vec_IntEntry(vGates,iLit1 + 1);
    iVar4 = Abc_Lit2Var(iVar2);
    i_00 = Abc_Lit2Var(iVar3);
    if (iVar4 < nVars) {
      local_68 = Vec_IntEntry(vUsed,iVar4);
    }
    else {
      local_68 = Vec_IntEntry(vCopy,iVar4 - nVars);
    }
    if (i_00 < nVars) {
      local_6c = Vec_IntEntry(vUsed,i_00);
    }
    else {
      local_6c = Vec_IntEntry(vCopy,i_00 - nVars);
    }
    if (iVar4 < i_00) {
      if (fHash == 0) {
        iVar2 = Abc_LitIsCompl(iVar2);
        iVar2 = Abc_LitNotCond(local_68,iVar2);
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar3 = Abc_LitNotCond(local_6c,iVar3);
        iVar0 = Gia_ManAppendAnd(pNew,iVar2,iVar3);
      }
      else {
        iVar2 = Abc_LitIsCompl(iVar2);
        iVar2 = Abc_LitNotCond(local_68,iVar2);
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar3 = Abc_LitNotCond(local_6c,iVar3);
        iVar0 = Gia_ManHashAnd(pNew,iVar2,iVar3);
      }
    }
    else {
      if (iVar4 <= i_00) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x22a,
                      "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar4 = Abc_LitIsCompl(iVar2);
      if (iVar4 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x223,
                      "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      iVar4 = Abc_LitIsCompl(iVar3);
      if (iVar4 != 0) {
        __assert_fail("!Abc_LitIsCompl(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x224,
                      "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      if (fHash == 0) {
        iVar2 = Abc_LitIsCompl(iVar2);
        iVar2 = Abc_LitNotCond(local_68,iVar2);
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar3 = Abc_LitNotCond(local_6c,iVar3);
        iVar0 = Gia_ManAppendXor(pNew,iVar2,iVar3);
      }
      else {
        iVar2 = Abc_LitIsCompl(iVar2);
        iVar2 = Abc_LitNotCond(local_68,iVar2);
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar3 = Abc_LitNotCond(local_6c,iVar3);
        iVar0 = Gia_ManHashXor(pNew,iVar2,iVar3);
      }
    }
    Vec_IntPush(vCopy,iVar0);
    iLit1 = iLit1 + 2;
  } while( true );
}

Assistant:

int Gia_ManConstructFromMap( Gia_Man_t * pNew, Vec_Int_t * vGates, int nVars, Vec_Int_t * vUsed, Vec_Int_t * vCopy, int fHash )
{
    int i, iLit0, iLit1, iLitRes, iTopLit = Vec_IntEntryLast( vGates );
    assert( Vec_IntSize(vUsed) == nVars );
    assert( Vec_IntSize(vGates) > 1 );
    assert( Vec_IntSize(vGates) % 2 == 1 );
    assert( Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(vGates)/2-1 );
    Vec_IntClear( vCopy );
    Vec_IntForEachEntryDouble( vGates, iLit0, iLit1, i )
    {
        int iVar0 = Abc_Lit2Var(iLit0);
        int iVar1 = Abc_Lit2Var(iLit1);
        int iRes0 = iVar0 < nVars ? Vec_IntEntry(vUsed, iVar0) : Vec_IntEntry(vCopy, iVar0 - nVars);
        int iRes1 = iVar1 < nVars ? Vec_IntEntry(vUsed, iVar1) : Vec_IntEntry(vCopy, iVar1 - nVars);
        if ( iVar0 < iVar1 )
        {
            if ( fHash )
                iLitRes = Gia_ManHashAnd( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
            else
                iLitRes = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
        }
        else if ( iVar0 > iVar1 )
        {
            assert( !Abc_LitIsCompl(iLit0) );
            assert( !Abc_LitIsCompl(iLit1) );
            if ( fHash )
                iLitRes = Gia_ManHashXor( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
            else
                iLitRes = Gia_ManAppendXor( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
        }
        else assert( 0 );
        Vec_IntPush( vCopy, iLitRes );
    }
    assert( Vec_IntSize(vCopy) == Vec_IntSize(vGates)/2 );
    iLitRes = Vec_IntEntry( vCopy, Vec_IntSize(vGates)/2-1 );
    return iLitRes;
}